

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O0

void PVG_FT_Vector_Polarize(PVG_FT_Vector *vec,PVG_FT_Fixed *length,PVG_FT_Angle *angle)

{
  PVG_FT_Fixed PVar1;
  ulong local_40;
  undefined1 local_38 [8];
  PVG_FT_Vector v;
  PVG_FT_Int shift;
  PVG_FT_Angle *angle_local;
  PVG_FT_Fixed *length_local;
  PVG_FT_Vector *vec_local;
  
  local_38 = (undefined1  [8])vec->x;
  v.x = vec->y;
  if ((local_38 != (undefined1  [8])0x0) || (v.x != 0)) {
    v.y._4_4_ = ft_trig_prenorm((PVG_FT_Vector *)local_38);
    ft_trig_pseudo_polarize((PVG_FT_Vector *)local_38);
    PVar1 = ft_trig_downscale((PVG_FT_Fixed)local_38);
    if (v.y._4_4_ < 0) {
      local_40 = (ulong)(uint)((int)PVar1 << (-(byte)v.y._4_4_ & 0x1f));
    }
    else {
      local_40 = PVar1 >> ((byte)v.y._4_4_ & 0x3f);
    }
    *length = local_40;
    *angle = v.x;
  }
  return;
}

Assistant:

void PVG_FT_Vector_Polarize(PVG_FT_Vector* vec, PVG_FT_Fixed* length,
    PVG_FT_Angle* angle)
{
    PVG_FT_Int    shift;
    PVG_FT_Vector v;

    v = *vec;

    if (v.x == 0 && v.y == 0) return;

    shift = ft_trig_prenorm(&v);
    ft_trig_pseudo_polarize(&v);

    v.x = ft_trig_downscale(v.x);

    *length = (shift >= 0) ? (v.x >> shift)
                           : (PVG_FT_Fixed)((PVG_FT_UInt32)v.x << -shift);
    *angle = v.y;
}